

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_formatter-inl.h
# Opt level: O2

int __thiscall
spdlog::json_formatter::clone
          (json_formatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer *__ptr;
  code *pcVar1;
  populator_set populators;
  _Head_base<0UL,_spdlog::populators::populator_*,_false> local_68;
  _Hashtable<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = __fn + 0x38;
  while (pcVar1 = *(code **)pcVar1, pcVar1 != (code *)0x0) {
    (**(code **)(**(long **)(pcVar1 + 8) + 0x18))(&local_68);
    std::__detail::
    _Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&local_60,(value_type *)&local_68);
    if (local_68._M_head_impl != (populator *)0x0) {
      (*(local_68._M_head_impl)->_vptr_populator[1])();
    }
  }
  details::
  make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>,std::__cxx11::string_const&>
            ((details *)&local_68,
             (unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
              *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 8));
  (this->super_formatter)._vptr_formatter = (_func_int **)local_68._M_head_impl;
  std::
  _Hashtable<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> json_formatter::clone() const
{
    populators::populator_set populators;
    for (const auto &populator : populators_)
    {
        populators.insert(populator->clone());
    }
    return details::make_unique<json_formatter>(std::move(populators), kEOL);
}